

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnvalue * parsevalue(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  char *pcVar2;
  rnnauthor **pprVar3;
  _xmlNode *p_Var4;
  char *in_RDX;
  rnndb *in_RSI;
  rnndb *in_RDI;
  xmlNode *chain;
  xmlAttr *attr;
  rnnvalue *val;
  _xmlAttr *attr_00;
  rnndb *local_8;
  
  local_8 = (rnndb *)calloc(0x68,1);
  local_8->spectypes = (rnnspectype **)in_RSI;
  for (attr_00 = *(_xmlAttr **)(in_RDX + 0x58); attr_00 != (_xmlAttr *)0x0; attr_00 = attr_00->next)
  {
    iVar1 = strcmp((char *)attr_00->name,"name");
    if (iVar1 == 0) {
      pcVar2 = getattrib(in_RSI,in_RDX,(int)((ulong)local_8 >> 0x20),attr_00);
      pcVar2 = strdup(pcVar2);
      *(char **)&local_8->copyright = pcVar2;
    }
    else {
      iVar1 = strcmp((char *)attr_00->name,"value");
      if (iVar1 == 0) {
        pprVar3 = (rnnauthor **)
                  getnumattrib(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),(xmlAttr *)local_8
                              );
        (local_8->copyright).authors = pprVar3;
        *(xmlElementType *)&(local_8->copyright).license = XML_ELEMENT_NODE;
      }
      else {
        iVar1 = strcmp((char *)attr_00->name,"varset");
        if (iVar1 == 0) {
          pcVar2 = getattrib(in_RSI,in_RDX,(int)((ulong)local_8 >> 0x20),attr_00);
          p_Var4 = (_xmlNode *)strdup(pcVar2);
          local_8->enums = (rnnenum **)p_Var4;
        }
        else {
          iVar1 = strcmp((char *)attr_00->name,"variants");
          if (iVar1 == 0) {
            pcVar2 = getattrib(in_RSI,in_RDX,(int)((ulong)local_8 >> 0x20),attr_00);
            p_Var4 = (_xmlNode *)strdup(pcVar2);
            *(_xmlNode **)&local_8->enumsnum = p_Var4;
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for value\n",in_RSI,
                    (ulong)*(ushort *)(in_RDX + 0x70),attr_00->name);
            in_RDI->estatus = 1;
          }
        }
      }
    }
  }
  pcVar2 = (char *)0x0;
  for (p_Var4 = *(_xmlNode **)(in_RDX + 0x18); p_Var4 != (_xmlNode *)0x0; p_Var4 = p_Var4->next) {
    if (((p_Var4->type == XML_ELEMENT_NODE) &&
        (iVar1 = trytop(in_RSI,in_RDX,(xmlNode *)local_8), iVar1 == 0)) &&
       (iVar1 = trydoc(local_8,pcVar2,p_Var4), iVar1 == 0)) {
      fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",in_RSI,(ulong)p_Var4->line,
              *(undefined8 *)(in_RDX + 0x10),p_Var4->name);
      in_RDI->estatus = 1;
    }
  }
  if (*(void **)&local_8->copyright == (void *)0x0) {
    fprintf(_stderr,"%s:%d: nameless value\n",in_RSI,(ulong)*(ushort *)(in_RDX + 0x70));
    in_RDI->estatus = 1;
    local_8 = (rnndb *)0x0;
  }
  return (rnnvalue *)local_8;
}

Assistant:

static struct rnnvalue *parsevalue(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnvalue *val = calloc(sizeof *val, 1);
	val->file = file;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			val->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "value")) {
			val->value = getnumattrib(db, file, node->line, attr);
			val->valvalid = 1;
		} else if (!strcmp(attr->name, "varset")) {
			val->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			val->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for value\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!val->name) {
		fprintf (stderr, "%s:%d: nameless value\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return val;
	}
}